

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* string_split<std::__cxx11::string>(string *input,char separator)

{
  char in_DL;
  ulong in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string part;
  size_t separator_pos;
  size_t begin_pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  string local_48 [32];
  long local_28;
  long local_20;
  undefined1 local_12;
  char local_11;
  ulong local_10;
  
  local_12 = 0;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1a3930);
  local_20 = 0;
  local_28 = std::__cxx11::string::find((char)local_10,(ulong)(uint)(int)local_11);
  while (local_28 != -1) {
    std::__cxx11::string::substr((ulong)local_48,local_10);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_20 = local_28 + 1;
    local_28 = std::__cxx11::string::find((char)local_10,(ulong)(uint)(int)local_11);
    std::__cxx11::string::~string(local_48);
  }
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffff88,local_10);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  return in_RDI;
}

Assistant:

std::vector<std::string> string_split<std::string>(const std::string & input, char separator)
{
    std::vector<std::string> parts;
    size_t begin_pos = 0;
    size_t separator_pos = input.find(separator);
    while (separator_pos != std::string::npos) {
        std::string part = input.substr(begin_pos, separator_pos - begin_pos);
        parts.emplace_back(part);
        begin_pos = separator_pos + 1;
        separator_pos = input.find(separator, begin_pos);
    }
    parts.emplace_back(input.substr(begin_pos, separator_pos - begin_pos));
    return parts;
}